

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Infector_private.hpp
# Opt level: O0

void __thiscall Infector::Container::~Container(Container *this)

{
  bool bVar1;
  pointer ppVar2;
  _Node_iterator_base<std::pair<const_std::type_index,_Infector::IAnyShared_*>,_false> local_20;
  iterator it;
  iterator it2;
  Container *this_local;
  
  it = std::
       unordered_map<std::type_index,_Infector::IAnyShared_*,_std::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_Infector::IAnyShared_*>_>_>
       ::end(&this->singleIstances);
  local_20._M_cur =
       (__node_type *)
       std::
       unordered_map<std::type_index,_Infector::IAnyShared_*,_std::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_Infector::IAnyShared_*>_>_>
       ::begin(&this->singleIstances);
  while (bVar1 = std::__detail::operator!=
                           (&local_20,
                            &it.
                             super__Node_iterator_base<std::pair<const_std::type_index,_Infector::IAnyShared_*>,_false>
                           ), bVar1) {
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<const_std::type_index,_Infector::IAnyShared_*>,_false,_false>
             ::operator->((_Node_iterator<std::pair<const_std::type_index,_Infector::IAnyShared_*>,_false,_false>
                           *)&local_20);
    if (ppVar2->second != (IAnyShared *)0x0) {
      ppVar2 = std::__detail::
               _Node_iterator<std::pair<const_std::type_index,_Infector::IAnyShared_*>,_false,_false>
               ::operator->((_Node_iterator<std::pair<const_std::type_index,_Infector::IAnyShared_*>,_false,_false>
                             *)&local_20);
      if (ppVar2->second != (IAnyShared *)0x0) {
        (*ppVar2->second->_vptr_IAnyShared[4])();
      }
    }
    std::__detail::
    _Node_iterator<std::pair<const_std::type_index,_Infector::IAnyShared_*>,_false,_false>::
    operator++((_Node_iterator<std::pair<const_std::type_index,_Infector::IAnyShared_*>,_false,_false>
                *)&local_20);
  }
  std::__cxx11::
  list<std::function<bool_(Infector::RecursionLimit_*,_int_*)>,_std::allocator<std::function<bool_(Infector::RecursionLimit_*,_int_*)>_>_>
  ::~list(&this->recursionWaitList);
  std::
  unordered_map<std::type_index,_std::function<bool_(Infector::RecursionLimit_*,_int_*)>,_std::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::function<bool_(Infector::RecursionLimit_*,_int_*)>_>_>_>
  ::~unordered_map(&this->recursionMap);
  std::
  unordered_map<std::type_index,_int,_std::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_int>_>_>
  ::~unordered_map(&this->typeInfoMap);
  std::
  unordered_map<std::type_index,_std::function<void_*(Infector::Container::EmplaceContext_*)>,_std::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::function<void_*(Infector::Container::EmplaceContext_*)>_>_>_>
  ::~unordered_map(&this->callbacks);
  std::
  unordered_map<std::type_index,_Infector::Container::Binding,_std::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_Infector::Container::Binding>_>_>
  ::~unordered_map(&this->typeMap);
  std::
  unordered_map<std::type_index,_Infector::IAnyShared_*,_std::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_Infector::IAnyShared_*>_>_>
  ::~unordered_map(&this->singleIstances);
  return;
}

Assistant:

inline Container::~Container(){
        auto it2 = singleIstances.end();
        for( auto it=singleIstances.begin(); it!=it2; ++it){
            if(it->second!=nullptr)
                delete it->second;
        }
    }